

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_value
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          json_visitor *visitor,uint8_t type,error_code *ec)

{
  size_t *psVar1;
  string_type *buffer;
  char *first;
  pointer ppVar2;
  pointer puVar3;
  pointer pcVar4;
  value_type *pvVar5;
  int iVar6;
  bson_errc __e;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  size_t length;
  type_conflict2 tVar14;
  _func_int **pp_Var15;
  undefined7 in_register_00000011;
  size_t length_00;
  size_t length_01;
  undefined8 uVar16;
  ulong uVar17;
  size_t sVar18;
  size_t sVar19;
  ulong uVar20;
  uint8_t *puVar21;
  value_type *pvVar22;
  size_t len;
  type tVar23;
  decimal128_to_chars_result dVar24;
  undefined8 uStack_b0;
  uint8_t buf [8];
  uint8_t buf_4 [4];
  uint8_t uStack_94;
  uint8_t uStack_93;
  uint8_t uStack_92;
  uint8_t uStack_91;
  ulong uStack_90;
  uint8_t subtype;
  pointer local_38;
  
  puVar21 = buf;
  iVar6 = (int)CONCAT71(in_register_00000011,type);
  switch(iVar6) {
  case 1:
    pvVar22 = (this->source_).current_;
    uVar17 = (long)(this->source_).end_ - (long)pvVar22;
    sVar18 = 8;
    if (uVar17 < 8) {
      sVar18 = uVar17;
    }
    memcpy(buf,pvVar22,sVar18);
    (this->source_).current_ = pvVar22 + sVar18;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar18;
    if (7 < uVar17) {
      (*visitor->_vptr_basic_json_visitor[0x12])(buf._0_4_,visitor,0,this,ec);
LAB_0015f057:
      bVar13 = this->cursor_mode_ ^ 1;
      goto LAB_0015f05c;
    }
    break;
  case 3:
    begin_document(this,visitor,ec);
    return;
  case 4:
    begin_array(this,visitor,ec);
    return;
  case 5:
    pvVar22 = (this->source_).current_;
    pvVar5 = (this->source_).end_;
    uVar17 = (long)pvVar5 - (long)pvVar22;
    sVar18 = 4;
    if (uVar17 < 4) {
      sVar18 = uVar17;
    }
    memcpy(buf_4,pvVar22,sVar18);
    pvVar22 = pvVar22 + sVar18;
    (this->source_).current_ = pvVar22;
    ppVar2 = (this->state_stack_).
             super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar19 = sVar18 + ppVar2[-1].pos;
    ppVar2[-1].pos = sVar19;
    if (uVar17 < 4) {
      __e = unexpected_eof;
      goto LAB_0015ea3b;
    }
    length = (size_t)(int)buf_4;
    if ((long)length < 0) {
      __e = length_is_negative;
      goto LAB_0015ea3b;
    }
    uVar17 = (ulong)(pvVar5 != pvVar22);
    memcpy(&subtype,pvVar22,uVar17);
    (this->source_).current_ = pvVar22 + uVar17;
    ppVar2[-1].pos = sVar19 + uVar17;
    if (pvVar5 != pvVar22) {
      puVar3 = (this->bytes_buffer_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar3) {
        (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar3;
      }
      tVar14 = source_reader<jsoncons::bytes_source>::
               read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         (&this->source_,&this->bytes_buffer_,length);
      psVar1 = &(this->state_stack_).
                super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
      *psVar1 = *psVar1 + tVar14;
      if (tVar14 == length) {
        buf = (uint8_t  [8])
              (this->bytes_buffer_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
        (*visitor->_vptr_basic_json_visitor[0xe])(visitor,buf,_subtype & 0xff,this,ec);
        goto LAB_0015f057;
      }
    }
    break;
  case 6:
    pp_Var15 = visitor->_vptr_basic_json_visitor;
    uVar16 = 0xd;
    goto LAB_0015ef94;
  case 7:
    pvVar22 = (this->source_).current_;
    uVar17 = (long)(this->source_).end_ - (long)pvVar22;
    sVar18 = 0xc;
    if (uVar17 < 0xc) {
      sVar18 = uVar17;
    }
    memcpy(buf_4,pvVar22,sVar18);
    (this->source_).current_ = pvVar22 + sVar18;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar18;
    if (0xb < uVar17) {
      uVar20 = (ulong)_buf_4 & 0xff;
      uVar17 = (ulong)_buf_4 >> 8;
      uVar7 = (ulong)_buf_4 >> 0x10;
      uVar8 = (ulong)_buf_4 >> 0x18;
      uVar9 = (ulong)_buf_4 >> 0x20;
      uVar10 = (ulong)_buf_4 >> 0x28;
      uVar11 = (ulong)_buf_4 >> 0x30;
      uVar12 = (ulong)_buf_4 >> 0x38;
      std::__cxx11::string::resize((ulong)&this->text_buffer_,'\x18');
      pcVar4 = (this->text_buffer_)._M_dataplus._M_p;
      *(undefined2 *)pcVar4 =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            uVar20 * 2);
      *(undefined2 *)(pcVar4 + 2) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar17 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 4) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar7 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 6) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar8 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 8) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar9 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 10) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar10 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 0xc) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar11 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 0xe) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            uVar12 * 2);
      *(undefined2 *)(pcVar4 + 0x10) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uStack_90 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 0x12) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uStack_90 >> 8 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 0x14) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uStack_90 >> 0x10 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 0x16) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uStack_90 >> 0x18 & 0xff) * 2);
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var15 = visitor->_vptr_basic_json_visitor;
      uStack_b0 = 0x13;
LAB_0015ef13:
      (*pp_Var15[0xc])(visitor,puVar21,uStack_b0,this,ec);
      goto LAB_0015f057;
    }
    break;
  case 8:
    pvVar22 = (this->source_).current_;
    pvVar5 = (this->source_).end_;
    uVar17 = (ulong)(pvVar5 != pvVar22);
    memcpy(buf,pvVar22,uVar17);
    (this->source_).current_ = pvVar22 + uVar17;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + uVar17;
    if (pvVar5 != pvVar22) {
      (*visitor->_vptr_basic_json_visitor[0xb])(visitor,(ulong)(buf[0] != '\0'),0,this,ec);
      goto LAB_0015f057;
    }
    break;
  case 9:
    pvVar22 = (this->source_).current_;
    uVar17 = (long)(this->source_).end_ - (long)pvVar22;
    sVar18 = 8;
    if (uVar17 < 8) {
      sVar18 = uVar17;
    }
    memcpy(buf,pvVar22,sVar18);
    (this->source_).current_ = pvVar22 + sVar18;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar18;
    if (7 < uVar17) {
      pp_Var15 = visitor->_vptr_basic_json_visitor;
      uVar16 = 6;
LAB_0015eff7:
      (*pp_Var15[0x10])(visitor,buf,uVar16,this,ec);
      goto LAB_0015f057;
    }
    break;
  case 10:
    pp_Var15 = visitor->_vptr_basic_json_visitor;
    uVar16 = 0;
LAB_0015ef94:
    (*pp_Var15[10])(visitor,uVar16,this,ec);
    goto LAB_0015ef9d;
  case 0xb:
    (this->text_buffer_)._M_string_length = 0;
    buffer = &this->text_buffer_;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
    pp_Var15 = visitor->_vptr_basic_json_visitor;
    uStack_b0 = 0x14;
    goto LAB_0015ec7b;
  case 0xc:
  case 0xf:
switchD_0015e969_caseD_c:
    __e = unknown_type;
    goto LAB_0015ea3b;
  case 0xd:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar23 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length_01);
    if (tVar23.ec == success) {
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var15 = visitor->_vptr_basic_json_visitor;
      uStack_b0 = 0x15;
      goto LAB_0015ec7b;
    }
    goto LAB_0015f07d;
  case 0x10:
    pvVar22 = (this->source_).current_;
    uVar17 = (long)(this->source_).end_ - (long)pvVar22;
    sVar18 = 4;
    if (uVar17 < 4) {
      sVar18 = uVar17;
    }
    memcpy(buf,pvVar22,sVar18);
    (this->source_).current_ = pvVar22 + sVar18;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar18;
    if (3 < uVar17) {
      buf = (uint8_t  [8])(long)(int)buf._0_4_;
LAB_0015efef:
      pp_Var15 = visitor->_vptr_basic_json_visitor;
      uVar16 = 0;
      goto LAB_0015eff7;
    }
    break;
  case 0x11:
    pvVar22 = (this->source_).current_;
    uVar17 = (long)(this->source_).end_ - (long)pvVar22;
    sVar18 = 8;
    if (uVar17 < 8) {
      sVar18 = uVar17;
    }
    memcpy(buf,pvVar22,sVar18);
    (this->source_).current_ = pvVar22 + sVar18;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar18;
    if (7 < uVar17) {
      (*visitor->_vptr_basic_json_visitor[0xf])(visitor,buf,0,this,ec);
      goto LAB_0015f057;
    }
    break;
  case 0x12:
    pvVar22 = (this->source_).current_;
    uVar17 = (long)(this->source_).end_ - (long)pvVar22;
    sVar18 = 8;
    if (uVar17 < 8) {
      sVar18 = uVar17;
    }
    memcpy(buf,pvVar22,sVar18);
    (this->source_).current_ = pvVar22 + sVar18;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar18;
    if (7 < uVar17) goto LAB_0015efef;
    break;
  case 0x13:
    pvVar22 = (this->source_).current_;
    uVar17 = (long)(this->source_).end_ - (long)pvVar22;
    sVar18 = 0x10;
    if (uVar17 < 0x10) {
      sVar18 = uVar17;
    }
    memcpy(buf,pvVar22,sVar18);
    (this->source_).current_ = pvVar22 + sVar18;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar18;
    if (0xf < uVar17) {
      buf_4[0] = buf[0];
      buf_4[1] = buf[1];
      buf_4[2] = buf[2];
      buf_4[3] = buf[3];
      uStack_94 = buf[4];
      uStack_93 = buf[5];
      uStack_92 = buf[6];
      uStack_91 = buf[7];
      (this->text_buffer_)._M_string_length = 0;
      *(this->text_buffer_)._M_dataplus._M_p = '\0';
      std::__cxx11::string::resize((ulong)&this->text_buffer_,'*');
      first = (this->text_buffer_)._M_dataplus._M_p;
      dVar24 = decimal128_to_chars(first,first + (this->text_buffer_)._M_string_length,
                                   (decimal128_t *)buf_4);
      local_38 = (this->text_buffer_)._M_dataplus._M_p;
      _subtype = (long)dVar24.ptr - (long)local_38;
      puVar21 = &subtype;
      pp_Var15 = visitor->_vptr_basic_json_visitor;
      uStack_b0 = 0xb;
      goto LAB_0015ef13;
    }
    break;
  default:
    if ((iVar6 != 0x7f) && (iVar6 != 0xff)) goto switchD_0015e969_caseD_c;
  case 2:
  case 0xe:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar23 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length_00);
    if (tVar23.ec != success) {
LAB_0015f07d:
      __e = invalid_utf8_text_string;
LAB_0015ea3b:
      std::error_code::operator=(ec,__e);
      this->more_ = false;
      return;
    }
    buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
    pp_Var15 = visitor->_vptr_basic_json_visitor;
    uStack_b0 = 0;
LAB_0015ec7b:
    (*pp_Var15[0xc])(visitor,buf,uStack_b0,this,ec);
LAB_0015ef9d:
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
    return;
  }
  std::error_code::operator=(ec,unexpected_eof);
  bVar13 = false;
LAB_0015f05c:
  this->more_ = (bool)bVar13;
  return;
}

Assistant:

void read_value(json_visitor& visitor, uint8_t type, std::error_code& ec)
    {
        switch (type)
        {
            case jsoncons::bson::bson_type::double_type:
            {
                uint8_t buf[sizeof(double)]; 
                std::size_t n = source_.read(buf, sizeof(double));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(double)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                double res = binary::little_to_native<double>(buf, sizeof(buf));
                visitor.double_value(res, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::symbol_type:
            case jsoncons::bson::bson_type::min_key_type:
            case jsoncons::bson::bson_type::max_key_type:
            case jsoncons::bson::bson_type::string_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::javascript_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::code, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::regex_type:
            {
                text_buffer_.clear();
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::regex, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::document_type: 
            {
                begin_document(visitor,ec);
                break;
            }

            case jsoncons::bson::bson_type::array_type: 
            {
                begin_array(visitor,ec);
                break;
            }
            case jsoncons::bson::bson_type::undefined_type: 
                {
                    visitor.null_value(semantic_tag::undefined, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
            case jsoncons::bson::bson_type::null_type: 
            {
                visitor.null_value(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::bool_type:
            {
                uint8_t c;
                std::size_t n = source_.read(&c, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                visitor.bool_value(c != 0, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::int32_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int32_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::timestamp_type: 
            {
                uint8_t buf[sizeof(uint64_t)]; 
                std::size_t n = source_.read(buf, sizeof(uint64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(uint64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<uint64_t>(buf, sizeof(buf));
                visitor.uint64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::int64_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::datetime_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::epoch_milli, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::binary_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                const auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
                if (JSONCONS_UNLIKELY(len < 0))
                {
                    ec = bson_errc::length_is_negative;
                    more_ = false;
                    return;
                }
                uint8_t subtype;
                n = source_.read(&subtype, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                bytes_buffer_.clear();
                n = source_reader<Source>::read(source_, bytes_buffer_, len);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != static_cast<std::size_t>(len)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                visitor.byte_string_value(bytes_buffer_, 
                                                  subtype, 
                                                  *this,
                                                  ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::decimal128_type: 
            {
                uint8_t buf[sizeof(uint64_t)*2]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                decimal128_t dec;
                dec.low = binary::little_to_native<uint64_t>(buf, sizeof(uint64_t));
                dec.high = binary::little_to_native<uint64_t>(buf+sizeof(uint64_t), sizeof(uint64_t));

                text_buffer_.clear();
                text_buffer_.resize(bson::decimal128_limits::buf_size);
                auto r = bson::decimal128_to_chars(&text_buffer_[0], &text_buffer_[0]+text_buffer_.size(), dec);
                visitor.string_value(string_view(text_buffer_.data(),static_cast<std::size_t>(r.ptr-text_buffer_.data())), semantic_tag::float128, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::object_id_type: 
            {
                uint8_t buf[12]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                oid_t oid(buf);
                to_string(oid, text_buffer_);

                visitor.string_value(text_buffer_, semantic_tag::id, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            default:
            {
                ec = bson_errc::unknown_type;
                more_ = false;
                return;
            }
        }
    }